

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder_internal.h
# Opt level: O1

bool __thiscall
basist::bitwise_decoder::read_huffman_table(bitwise_decoder *this,huffman_decoding_table *ct)

{
  char cVar1;
  void *pvVar2;
  uint32_t min_new_capacity;
  uint32_t uVar3;
  uint32_t uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  char *__function;
  uint uVar9;
  uint uVar10;
  undefined1 uVar11;
  uint32_t new_size;
  byte *pbVar12;
  byte *pbVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  bool bVar17;
  uint8_vec code_sizes;
  huffman_decoding_table code_length_table;
  uint8_t code_length_code_sizes [21];
  elemental_vector local_88;
  huffman_decoding_table local_78;
  undefined8 local_48;
  undefined5 uStack_40;
  undefined3 uStack_3b;
  undefined5 uStack_38;
  
  huffman_decoding_table::clear(ct);
  min_new_capacity = get_bits(this,0xe);
  if (min_new_capacity == 0) {
    bVar17 = true;
  }
  else {
    if (min_new_capacity < 0x4001) {
      local_48 = 0;
      uStack_40 = 0;
      uStack_3b = 0;
      uStack_38 = 0;
      uVar3 = get_bits(this,5);
      if (0xffffffea < uVar3 - 0x16) {
        if (uVar3 != 0) {
          uVar15 = 0;
          do {
            uVar4 = get_bits(this,3);
            *(char *)((long)&local_48 +
                     (ulong)(byte)(&basisu::g_huffman_sorted_codelength_codes)[uVar15]) =
                 (char)uVar4;
            uVar15 = uVar15 + 1;
          } while (uVar3 != uVar15);
        }
        local_78.m_tree.m_p = (short *)0x0;
        local_78.m_tree.m_size = 0;
        local_78.m_tree.m_capacity = 0;
        local_78.m_lookup.m_p = (int *)0x0;
        local_78.m_lookup.m_size = 0;
        local_78.m_lookup.m_capacity = 0;
        local_78.m_code_sizes.m_p = (uchar *)0x0;
        local_78.m_code_sizes.m_size = 0;
        local_78.m_code_sizes.m_capacity = 0;
        iVar5 = huffman_decoding_table::init(&local_78,(EVP_PKEY_CTX *)0x15);
        if (((char)iVar5 == '\0') || (local_78.m_code_sizes.m_size == 0)) {
          uVar11 = 0;
        }
        else {
          local_88.m_p = (void *)0x0;
          local_88.m_size = 0;
          local_88.m_capacity = 0;
          uVar15 = 0;
          basisu::elemental_vector::increase_capacity
                    (&local_88,min_new_capacity,min_new_capacity == 1,1,(object_mover)0x0,false);
          memset((void *)((local_88._8_8_ & 0xffffffff) + (long)local_88.m_p),0,
                 (ulong)(min_new_capacity - local_88.m_size));
          pvVar2 = local_88.m_p;
          local_88.m_size = min_new_capacity;
          do {
            uVar16 = (uint)uVar15;
            if (min_new_capacity <= uVar16) {
              if (uVar16 == min_new_capacity) {
                if (local_88.m_size == 0) {
LAB_0013ba8e:
                  __assert_fail("i < m_size",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                                ,0x178,
                                "T &basisu::vector<unsigned char>::operator[](size_t) [T = unsigned char]"
                               );
                }
                iVar5 = huffman_decoding_table::init(ct,(EVP_PKEY_CTX *)(ulong)min_new_capacity);
                uVar11 = (undefined1)iVar5;
                goto LAB_0013ba23;
              }
              break;
            }
            if (local_78.m_code_sizes.m_size == 0) {
              __assert_fail("ct.m_code_sizes.size()",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder_internal.h"
                            ,0x1bf,
                            "uint32_t basist::bitwise_decoder::decode_huffman(const huffman_decoding_table &, int)"
                           );
            }
            uVar6 = this->m_bit_buf_size;
            if (uVar6 < 0x10) {
              uVar14 = this->m_bit_buf;
              pbVar12 = this->m_pBuf;
              uVar9 = uVar6;
              do {
                uVar6 = 0;
                pbVar13 = pbVar12;
                if (pbVar12 < this->m_pBuf_end) {
                  pbVar13 = pbVar12 + 1;
                  this->m_pBuf = pbVar13;
                  uVar6 = (uint)*pbVar12;
                }
                uVar14 = uVar14 | uVar6 << ((byte)uVar9 & 0x1f);
                this->m_bit_buf = uVar14;
                uVar6 = uVar9 + 8;
                this->m_bit_buf_size = uVar6;
                bVar17 = uVar9 < 8;
                pbVar12 = pbVar13;
                uVar9 = uVar6;
              } while (bVar17);
            }
            uVar14 = this->m_bit_buf;
            if (local_78.m_lookup.m_size <= (uVar14 & 0x3ff)) {
              __function = "const T &basisu::vector<int>::operator[](size_t) const [T = int]";
LAB_0013ba84:
              __assert_fail("i < m_size",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                            ,0x177,__function);
            }
            uVar9 = local_78.m_lookup.m_p[uVar14 & 0x3ff];
            if ((int)uVar9 < 0) {
              uVar8 = 10;
              do {
                uVar10 = ~uVar9 + (uint)((uVar14 >> (uVar8 & 0x1f) & 1) != 0);
                if (local_78.m_tree.m_size <= uVar10) {
                  __function = 
                  "const T &basisu::vector<short>::operator[](size_t) const [T = short]";
                  goto LAB_0013ba84;
                }
                uVar8 = uVar8 + 1;
                uVar9 = (uint)local_78.m_tree.m_p[uVar10];
              } while (local_78.m_tree.m_p[uVar10] < 0);
            }
            else {
              uVar8 = uVar9 >> 0x10;
              uVar9 = uVar9 & 0xffff;
            }
            this->m_bit_buf = uVar14 >> ((byte)uVar8 & 0x1f);
            this->m_bit_buf_size = uVar6 - uVar8;
            if ((int)uVar9 < 0x11) {
              if (min_new_capacity <= uVar16) goto LAB_0013ba8e;
              uVar7 = uVar15 & 0xffffffff;
              uVar15 = (ulong)(uVar16 + 1);
              *(char *)((long)pvVar2 + uVar7) = (char)uVar9;
LAB_0013b980:
              bVar17 = true;
            }
            else {
              if (uVar9 == 0x12) {
                uVar3 = get_bits(this,7);
                uVar15 = (ulong)(uVar16 + uVar3 + 0xb);
                goto LAB_0013b980;
              }
              if (uVar9 == 0x11) {
                uVar3 = get_bits(this,3);
                uVar15 = (ulong)(uVar16 + uVar3 + 3);
                goto LAB_0013b980;
              }
              if (uVar16 == 0) {
                uVar15 = 0;
LAB_0013b9f5:
                bVar17 = false;
              }
              else {
                if (uVar9 == 0x13) {
                  uVar3 = get_bits(this,2);
                  iVar5 = uVar3 + 3;
                }
                else {
                  uVar3 = get_bits(this,7);
                  iVar5 = uVar3 + 7;
                }
                if (min_new_capacity <= uVar16 - 1) goto LAB_0013ba8e;
                cVar1 = *(char *)((long)pvVar2 + (ulong)(uVar16 - 1));
                if (cVar1 == '\0') goto LAB_0013b9f5;
                uVar15 = uVar15 & 0xffffffff;
                do {
                  bVar17 = uVar15 < min_new_capacity;
                  if (!bVar17) break;
                  if (!bVar17) goto LAB_0013ba8e;
                  *(char *)((long)pvVar2 + uVar15) = cVar1;
                  uVar15 = uVar15 + 1;
                  iVar5 = iVar5 + -1;
                } while (iVar5 != 0);
              }
            }
          } while (bVar17);
          uVar11 = 0;
LAB_0013ba23:
          if (local_88.m_p != (void *)0x0) {
            free(local_88.m_p);
          }
        }
        if (local_78.m_tree.m_p != (short *)0x0) {
          free(local_78.m_tree.m_p);
        }
        if (local_78.m_lookup.m_p != (int *)0x0) {
          free(local_78.m_lookup.m_p);
        }
        if (local_78.m_code_sizes.m_p == (uchar *)0x0) {
          return (bool)uVar11;
        }
        free(local_78.m_code_sizes.m_p);
        return (bool)uVar11;
      }
    }
    bVar17 = false;
  }
  return bVar17;
}

Assistant:

bool read_huffman_table(huffman_decoding_table &ct)
		{
			ct.clear();

			const uint32_t total_used_syms = get_bits(basisu::cHuffmanMaxSymsLog2);

			if (!total_used_syms)
				return true;
			if (total_used_syms > basisu::cHuffmanMaxSyms)
				return false;

			uint8_t code_length_code_sizes[basisu::cHuffmanTotalCodelengthCodes];
			basisu::clear_obj(code_length_code_sizes);

			const uint32_t num_codelength_codes = get_bits(5);
			if ((num_codelength_codes < 1) || (num_codelength_codes > basisu::cHuffmanTotalCodelengthCodes))
				return false;

			for (uint32_t i = 0; i < num_codelength_codes; i++)
				code_length_code_sizes[basisu::g_huffman_sorted_codelength_codes[i]] = static_cast<uint8_t>(get_bits(3));

			huffman_decoding_table code_length_table;
			if (!code_length_table.init(basisu::cHuffmanTotalCodelengthCodes, code_length_code_sizes))
				return false;

			if (!code_length_table.is_valid())
				return false;

			basisu::uint8_vec code_sizes(total_used_syms);

			uint32_t cur = 0;
			while (cur < total_used_syms)
			{
				int c = decode_huffman(code_length_table);

				if (c <= 16)
					code_sizes[cur++] = static_cast<uint8_t>(c);
				else if (c == basisu::cHuffmanSmallZeroRunCode)
					cur += get_bits(basisu::cHuffmanSmallZeroRunExtraBits) + basisu::cHuffmanSmallZeroRunSizeMin;
				else if (c == basisu::cHuffmanBigZeroRunCode)
					cur += get_bits(basisu::cHuffmanBigZeroRunExtraBits) + basisu::cHuffmanBigZeroRunSizeMin;
				else
				{
					if (!cur)
						return false;

					uint32_t l;
					if (c == basisu::cHuffmanSmallRepeatCode)
						l = get_bits(basisu::cHuffmanSmallRepeatExtraBits) + basisu::cHuffmanSmallRepeatSizeMin;
					else
						l = get_bits(basisu::cHuffmanBigRepeatExtraBits) + basisu::cHuffmanBigRepeatSizeMin;

					const uint8_t prev = code_sizes[cur - 1];
					if (prev == 0)
						return false;
					do
					{
						if (cur >= total_used_syms)
							return false;
						code_sizes[cur++] = prev;
					} while (--l > 0);
				}
			}

			if (cur != total_used_syms)
				return false;

			return ct.init(total_used_syms, &code_sizes[0]);
		}